

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::destroyImagesIter(CopyImageTest *this)

{
  ObjectWrapper *pOVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_328;
  MessageBuilder local_198;
  TestLog *local_18;
  TestLog *log;
  CopyImageTest *this_local;
  
  log = (TestLog *)this;
  local_18 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [24])"Deleting source image. ");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  pOVar1 = this->m_state->srcImage;
  if (pOVar1 != (ObjectWrapper *)0x0) {
    glu::ObjectWrapper::~ObjectWrapper(pOVar1);
    operator_delete(pOVar1,0x18);
  }
  this->m_state->srcImage = (ObjectWrapper *)0x0;
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::clear(&this->m_state->srcImageLevels);
  tcu::TestLog::operator<<(&local_328,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_328,(char (*) [29])"Deleting destination image. ")
  ;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_328);
  pOVar1 = this->m_state->dstImage;
  if (pOVar1 != (ObjectWrapper *)0x0) {
    glu::ObjectWrapper::~ObjectWrapper(pOVar1);
    operator_delete(pOVar1,0x18);
  }
  this->m_state->dstImage = (ObjectWrapper *)0x0;
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::clear(&this->m_state->dstImageLevels);
  return;
}

Assistant:

void CopyImageTest::destroyImagesIter (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "Deleting source image. " << TestLog::EndMessage;

	delete m_state->srcImage;
	m_state->srcImage = NULL;
	m_state->srcImageLevels.clear();

	log << TestLog::Message << "Deleting destination image. " << TestLog::EndMessage;

	delete m_state->dstImage;
	m_state->dstImage = NULL;
	m_state->dstImageLevels.clear();
}